

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O2

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_avx512_functor::binary_op_sub>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  int iVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [64];
  
  iVar6 = a->h * a->w * a->d * a->elempack;
  uVar10 = 0;
  uVar7 = (ulong)(uint)a->c;
  if (a->c < 1) {
    uVar7 = uVar10;
  }
  for (; uVar10 != uVar7; uVar10 = uVar10 + 1) {
    pvVar1 = a->data;
    pvVar2 = b->data;
    pvVar3 = c->data;
    lVar14 = c->elemsize * c->cstep * uVar10;
    lVar16 = b->elemsize * b->cstep * uVar10;
    lVar15 = a->elemsize * a->cstep * uVar10;
    lVar9 = 0;
    for (iVar8 = 0; iVar8 + 0xf < iVar6; iVar8 = iVar8 + 0x10) {
      auVar17 = vsubps_avx512f(*(undefined1 (*) [64])((long)pvVar1 + lVar9 + lVar15),
                               *(undefined1 (*) [64])((long)pvVar2 + lVar9 + lVar16));
      *(undefined1 (*) [64])((long)pvVar3 + lVar9 + lVar14) = auVar17;
      lVar9 = lVar9 + 0x40;
    }
    for (; iVar8 + 7 < iVar6; iVar8 = iVar8 + 8) {
      auVar5 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar1 + lVar9 + lVar15),
                          *(undefined1 (*) [32])((long)pvVar2 + lVar9 + lVar16));
      *(undefined1 (*) [32])((long)pvVar3 + lVar9 + lVar14) = auVar5;
      lVar9 = lVar9 + 0x20;
    }
    for (; iVar8 + 3 < iVar6; iVar8 = iVar8 + 4) {
      auVar4 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar1 + lVar9 + lVar15),
                          *(undefined1 (*) [16])((long)pvVar2 + lVar9 + lVar16));
      *(undefined1 (*) [16])((long)pvVar3 + lVar9 + lVar14) = auVar4;
      lVar9 = lVar9 + 0x10;
    }
    pfVar13 = (float *)((long)pvVar3 + lVar14 + lVar9);
    pfVar12 = (float *)((long)pvVar2 + lVar16 + lVar9);
    pfVar11 = (float *)((long)pvVar1 + lVar15 + lVar9);
    for (; iVar8 < iVar6; iVar8 = iVar8 + 1) {
      *pfVar13 = *pfVar11 - *pfVar12;
      pfVar11 = pfVar11 + 1;
      pfVar12 = pfVar12 + 1;
      pfVar13 = pfVar13 + 1;
    }
  }
  return iVar6;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}